

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emr_test.cc
# Opt level: O0

int test_modify_cluster_name(void)

{
  code *pcVar1;
  char *__s;
  EmrModifyClusterNameRequestType *pEVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_131;
  int ret;
  HttpTestListener *local_110;
  HttpTestListener *listener;
  string local_100;
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [55];
  allocator<char> local_79;
  string local_78 [32];
  EmrModifyClusterNameRequestType *local_58;
  Emr *emr;
  undefined1 local_48 [7];
  EmrModifyClusterNameResponseType resp;
  EmrModifyClusterNameRequestType req;
  
  aliyun::EmrModifyClusterNameRequestType::EmrModifyClusterNameRequestType
            ((EmrModifyClusterNameRequestType *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"cn-hangzhou",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"my_appid",&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"my_secret",&local_d9);
  pEVar2 = (EmrModifyClusterNameRequestType *)
           aliyun::Emr::CreateEmrClient(local_78,local_b0,local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  local_58 = pEVar2;
  if (pEVar2 == (EmrModifyClusterNameRequestType *)0x0) {
    aliyun::EmrModifyClusterNameRequestType::~EmrModifyClusterNameRequestType
              ((EmrModifyClusterNameRequestType *)local_48);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Emr::SetProxyHost((Emr *)pEVar2,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Emr::SetUseTls((Emr *)local_58,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_modify_cluster_name_response;
  local_110 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_131);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_131);
  HttpTestListener::Start(local_110);
  std::__cxx11::string::operator=((string *)local_48,"ClusterId");
  std::__cxx11::string::operator=((string *)(req.cluster_id.field_2._M_local_buf + 8),"ClusterName")
  ;
  aliyun::Emr::ModifyClusterName
            (local_58,(EmrModifyClusterNameResponseType *)local_48,(EmrErrorInfo *)((long)&emr + 7))
  ;
  HttpTestListener::WaitComplete(local_110);
  pHVar3 = local_110;
  if (local_110 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_110);
    operator_delete(pHVar3,0x180);
  }
  pEVar2 = local_58;
  if (local_58 != (EmrModifyClusterNameRequestType *)0x0) {
    aliyun::Emr::~Emr((Emr *)local_58);
    operator_delete(pEVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_modify_cluster_name() {
  EmrModifyClusterNameRequestType req;
  EmrModifyClusterNameResponseType resp;
  Emr* emr = Emr::CreateEmrClient("cn-hangzhou", "my_appid", "my_secret");
  if(!emr) return 0;
  emr->SetProxyHost("127.0.0.1:12234");
  emr->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_modify_cluster_name_response);
  listener->Start();
  req.cluster_id = "ClusterId";
  req.cluster_name = "ClusterName";
  int ret = emr->ModifyClusterName(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete emr;
}